

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

Territory findMatch(int parentNumber,char *territoryISO)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  Territory TVar5;
  char codeISO [8];
  AlphaRec t;
  
  TVar5 = TERRITORY_NONE;
  if (-1 < parentNumber) {
    if (parentNumber == 0) {
      lVar3 = 0;
    }
    else {
      codeISO._0_2_ =
           *(undefined2 *)
            ("?????BDFCGHJKLMNRSTUEPQWYZ?????????A????XV??????????????????????" +
            (ulong)(uint)parentNumber * 3 + 0x3e);
      codeISO[2] = '-';
      lVar3 = 3;
    }
    for (; cVar1 = *territoryISO, lVar3 != 7; lVar3 = lVar3 + 1) {
      if (cVar1 < '!') goto LAB_001cdcbf;
      territoryISO = territoryISO + 1;
      codeISO[lVar3] = cVar1;
    }
    if (cVar1 < '!') {
      lVar3 = 7;
LAB_001cdcbf:
      codeISO[lVar3] = '\0';
      makeUppercase(codeISO);
      t.alphaCode = codeISO;
      puVar4 = (undefined8 *)bsearch(&t,ALPHA_SEARCH,0x394,0x10,compareAlphaCode);
      if (puVar4 != (undefined8 *)0x0) {
        iVar2 = strcmp(t.alphaCode,(char *)*puVar4);
        if (iVar2 == 0) {
          TVar5 = *(Territory *)(puVar4 + 1);
        }
      }
    }
  }
  return TVar5;
}

Assistant:

static enum Territory findMatch(const int parentNumber, const char *territoryISO) {
    // build an uppercase search term
    char codeISO[MAX_ISOCODE_ASCII_LEN + 1];
    const char *r = territoryISO;
    int len = 0;
    ASSERT(territoryISO);

    if (parentNumber < 0) {
        return TERRITORY_NONE;
    }
    if (parentNumber > 0) {
        codeISO[0] = PARENTS_2[3 * parentNumber - 3];
        codeISO[1] = PARENTS_2[3 * parentNumber - 2];
        codeISO[2] = '-';
        len = 3;
    }
    while ((len < MAX_ISOCODE_ASCII_LEN) && (*r > 32)) {
        codeISO[len++] = *r++;
    }
    if (*r > 32) {
        return TERRITORY_NONE;
    }
    codeISO[len] = 0;
    makeUppercase(codeISO);
    { // binary-search the result
        const AlphaRec *p;
        AlphaRec t;
        t.alphaCode = codeISO;

        p = (const AlphaRec *) bsearch(&t, ALPHA_SEARCH, NR_TERRITORY_RECS, sizeof(AlphaRec), compareAlphaCode);
        if (p) {
            if (strcmp(t.alphaCode, p->alphaCode) == 0) { // only interested in PERFECT match
                return p->territory;
            } // match
        } // found
    } //
    return TERRITORY_NONE;
}